

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *p,int i)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead( p, i )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0xa6,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
  }
  p_00 = p->vClassOld;
  p_00->nSize = 0;
  p->vClassNew->nSize = 0;
  Vec_IntPush(p_00,i);
  Gia_ManObj(p,i);
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0xab,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
  }
  lVar4 = (long)i;
  while( true ) {
    iVar1 = p->pNexts[lVar4];
    lVar4 = (long)iVar1;
    if (lVar4 < 1) break;
    pGVar2 = Gia_ManObj(p,i);
    pGVar3 = Gia_ManObj(p,iVar1);
    Vec_IntPush((&p->vClassOld)
                [((uint)(*(ulong *)pGVar2 >> 0x1e) & 1 ^ (uint)(*(ulong *)pGVar2 >> 0x3f)) !=
                 ((uint)(*(ulong *)pGVar3 >> 0x1e) & 1 ^ (uint)(*(ulong *)pGVar3 >> 0x3f))],iVar1);
  }
  bVar5 = p->vClassNew->nSize != 0;
  if (bVar5) {
    Ssc_GiaSimClassCreate(p,p->vClassOld);
    Ssc_GiaSimClassCreate(p,p->vClassNew);
  }
  return (uint)bVar5;
}

Assistant:

int Ssc_GiaSimClassRefineOneBit( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqualBit( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    return 1;
}